

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DockSettingsRenameNodeReferences(ImGuiID old_node_id,ImGuiID new_node_id)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  ImGuiWindow **ppIVar3;
  ImGuiWindowSettings *local_30;
  ImGuiWindowSettings *settings;
  ImGuiWindow *window;
  int window_n;
  ImGuiContext *g;
  ImGuiID new_node_id_local;
  ImGuiID old_node_id_local;
  
  pIVar2 = GImGui;
  for (window._4_4_ = 0; window._4_4_ < (pIVar2->Windows).Size; window._4_4_ = window._4_4_ + 1) {
    ppIVar3 = ImVector<ImGuiWindow_*>::operator[](&pIVar2->Windows,window._4_4_);
    pIVar1 = *ppIVar3;
    if ((pIVar1->DockId == old_node_id) && (pIVar1->DockNode == (ImGuiDockNode *)0x0)) {
      pIVar1->DockId = new_node_id;
    }
  }
  for (local_30 = ImChunkStream<ImGuiWindowSettings>::begin(&pIVar2->SettingsWindows);
      local_30 != (ImGuiWindowSettings *)0x0;
      local_30 = ImChunkStream<ImGuiWindowSettings>::next_chunk(&pIVar2->SettingsWindows,local_30))
  {
    if (local_30->DockId == old_node_id) {
      local_30->DockId = new_node_id;
    }
  }
  return;
}

Assistant:

static void ImGui::DockSettingsRenameNodeReferences(ImGuiID old_node_id, ImGuiID new_node_id)
{
    ImGuiContext& g = *GImGui;
    IMGUI_DEBUG_LOG_DOCKING("DockSettingsRenameNodeReferences: from 0x%08X -> to 0x%08X\n", old_node_id, new_node_id);
    for (int window_n = 0; window_n < g.Windows.Size; window_n++)
    {
        ImGuiWindow* window = g.Windows[window_n];
        if (window->DockId == old_node_id && window->DockNode == NULL)
            window->DockId = new_node_id;
    }
    //// FIXME-OPT: We could remove this loop by storing the index in the map
    for (ImGuiWindowSettings* settings = g.SettingsWindows.begin(); settings != NULL; settings = g.SettingsWindows.next_chunk(settings))
        if (settings->DockId == old_node_id)
            settings->DockId = new_node_id;
}